

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O2

void __thiscall
kiste::line_data_t::line_data_t
          (line_data_t *this,line_type type,
          vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *segments)

{
  this->_type = type;
  std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
            (&this->_segments,segments);
  (this->_class_data)._name._M_dataplus._M_p = (pointer)&(this->_class_data)._name.field_2;
  (this->_class_data)._name._M_string_length = 0;
  (this->_class_data)._name.field_2._M_local_buf[0] = '\0';
  (this->_class_data)._parent_name._M_dataplus._M_p =
       (pointer)&(this->_class_data)._parent_name.field_2;
  (this->_class_data)._parent_name._M_string_length = 0;
  (this->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
  (this->_member).class_name._M_dataplus._M_p = (pointer)&(this->_member).class_name.field_2;
  (this->_member).class_name._M_string_length = 0;
  (this->_member).class_name.field_2._M_local_buf[0] = '\0';
  (this->_member).name._M_dataplus._M_p = (pointer)&(this->_member).name.field_2;
  (this->_member).name._M_string_length = 0;
  (this->_member).name.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

line_data_t(line_type type, const std::vector<segment_t>& segments)
        : _type(type), _segments(segments)
    {
    }